

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O0

int parseInteger(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  int local_38;
  int inside;
  int neg;
  int iStack_20;
  char ch;
  int value;
  int len_local;
  int start_local;
  char *str_local;
  
  neg = 0;
  bVar3 = false;
  bVar2 = false;
  if ((str == (char *)0x0) || (start < 0)) {
    str_local._4_4_ = 0;
  }
  else {
    iStack_20 = len;
    _len_local = str + start;
    while( true ) {
      iVar4 = iStack_20 + -1;
      bVar7 = false;
      if (0 < iStack_20) {
        bVar7 = *_len_local != '\0';
      }
      if (!bVar7) break;
      pcVar6 = _len_local + 1;
      cVar1 = *_len_local;
      iStack_20 = iVar4;
      _len_local = pcVar6;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 != '+') || (bVar2)) {
          if ((cVar1 != '-') || (bVar2)) {
            ppuVar5 = __ctype_b_loc();
            if ((((*ppuVar5)[(int)cVar1] & 0x2000) == 0) || (bVar2)) break;
          }
          else {
            bVar3 = true;
            bVar2 = true;
          }
        }
        else {
          bVar2 = true;
        }
      }
      else {
        neg = neg * 10 + cVar1 + -0x30;
        bVar2 = true;
      }
    }
    if (bVar3) {
      local_38 = -neg;
    }
    else {
      local_38 = neg;
    }
    str_local._4_4_ = local_38;
  }
  return str_local._4_4_;
}

Assistant:

int parseInteger(char *str, int start, int len) {
   register int value = 0;
   register char ch;
   int neg = 0, inside = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10*value) + (ch - '0');
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 neg = 1;
	 inside = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of integer */
   }
   return (neg?-value:value);
}